

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

_Bool Curl_conn_cf_discard_sub
                (Curl_cfilter *cf,Curl_cfilter *discard,Curl_easy *data,_Bool destroy_always)

{
  Curl_cfilter *pCVar1;
  Curl_cfilter *pCVar2;
  
  pCVar1 = cf;
  do {
    pCVar2 = pCVar1;
    pCVar1 = pCVar2->next;
    if (pCVar1 == (Curl_cfilter *)0x0) {
      if (destroy_always) goto LAB_00118683;
      goto LAB_001186a3;
    }
  } while (pCVar1 != cf);
  pCVar2->next = discard->next;
  discard->next = (Curl_cfilter *)0x0;
LAB_00118683:
  discard->next = (Curl_cfilter *)0x0;
  (*(code *)discard->cft->destroy)(discard,data);
  (*Curl_cfree)(discard);
LAB_001186a3:
  return pCVar1 != (Curl_cfilter *)0x0;
}

Assistant:

bool Curl_conn_cf_discard_sub(struct Curl_cfilter *cf,
                              struct Curl_cfilter *discard,
                              struct Curl_easy *data,
                              bool destroy_always)
{
  struct Curl_cfilter **pprev = &cf->next;
  bool found = FALSE;

  /* remove from sub-chain and destroy */
  DEBUGASSERT(cf);
  while(*pprev) {
    if(*pprev == cf) {
      *pprev = discard->next;
      discard->next = NULL;
      found = TRUE;
      break;
    }
    pprev = &((*pprev)->next);
  }
  if(found || destroy_always) {
    discard->next = NULL;
    discard->cft->destroy(discard, data);
    free(discard);
  }
  return found;
}